

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O0

void __thiscall Graph::readEdgesFromfile(Graph *this,string *inputFile)

{
  byte bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  undefined4 local_2b0;
  allocator local_2a9;
  string local_2a8 [32];
  string local_288 [32];
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string local_240 [8];
  string line;
  istream local_220 [8];
  ifstream is;
  string *inputFile_local;
  Graph *this_local;
  
  std::ifstream::ifstream(local_220,inputFile,8);
  std::__cxx11::string::string(local_240);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::string::string(local_288,local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"\t",&local_2a9);
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_268,(string *)local_288,(string *)local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string(local_288);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_268);
      if (sVar3 == 3) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_268,0);
        std::__cxx11::string::string(local_2d0,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_268,1);
        std::__cxx11::string::string(local_2f0,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_268,2);
        std::__cxx11::string::string(local_310,(string *)pvVar4);
        insertEdge(this,(string *)local_2d0,(string *)local_2f0,(string *)local_310);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::string::~string(local_2f0);
        std::__cxx11::string::~string(local_2d0);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
        local_2b0 = 0;
      }
      else {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
        local_2b0 = 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_240);
    std::ifstream::~ifstream(local_220);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)inputFile);
  poVar2 = std::operator<<(poVar2,"open failed.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(100);
}

Assistant:

void Graph::readEdgesFromfile(string inputFile) {
    ifstream is(inputFile);
    string line;

    if (!is.is_open()) {
        cout << inputFile << "open failed." << endl;
        exit(100);
    }

    getline(is, line);

    while (!is.eof()) {
        vector<string> v = split(line, "\t");

        if (v.size() != 3) {
            getline(is, line);
            continue;
        }

        this->insertEdge(v[0], v[1], v[2]);

        getline(is, line);
    }

    is.close();
}